

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *output,
               vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *input)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pLVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  pointer pLVar8;
  ulong uVar9;
  
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::resize
            (output,((long)(input->
                           super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(input->
                           super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pLVar8 = (input->super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((input->super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>).
      _M_impl.super__Vector_impl_data._M_finish != pLVar8) {
    lVar6 = 0x20;
    lVar7 = 0x10;
    uVar9 = 0;
    do {
      iVar3 = *(int *)((long)&pLVar8->v0 + lVar6);
      puVar1 = (undefined8 *)((long)pLVar8 + lVar6 + -0x18);
      uVar5 = puVar1[1];
      pLVar4 = (output->super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)pLVar4 + lVar7 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(int *)((long)&pLVar4->v0 + lVar7) = iVar3 + -1;
      uVar9 = uVar9 + 1;
      pLVar8 = (input->
               super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
      lVar7 = lVar7 + 0x18;
    } while (uVar9 < (ulong)(((long)(input->
                                    super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar8 >> 3)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Line>& output, std::vector<pa::LineAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex-1;
		output[i] = pa::Line(input[i].v1, input[i].v2, baseProvokingVertexIndex);
	}
}